

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

void __thiscall despot::BaseRockSample::BaseRockSample(BaseRockSample *this,string *map)

{
  Grid<int> *this_00;
  istream *piVar1;
  int *piVar2;
  int xsize;
  long lVar3;
  int c;
  int iVar4;
  int i;
  long lVar5;
  int iVar6;
  char tok;
  BaseRockSample *local_288;
  vector<despot::Coord,_std::allocator<despot::Coord>_> *local_280;
  int local_278;
  undefined4 uStack_274;
  BeliefMDP *local_270;
  Grid<int> *local_268;
  Coord *local_260;
  string tmp;
  ifstream fin;
  
  *(code **)this = despot::TrivialParticleUpperBound::TrivialParticleUpperBound;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  *(undefined ***)this = &PTR__BaseRockSample_0011d418;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseRockSample_0011d530;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseRockSample_0011d638;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseRockSample_0011d670;
  local_280 = &this->rock_pos_;
  local_260 = &this->start_pos_;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->grid_).grid_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_270 = &this->super_BeliefMDP;
  despot::Coord::Coord(local_260);
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memory_pool_).freelist_.
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).num_allocated_ = 0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory_pool_).chunks_.
  super__Vector_base<despot::MemoryPool<despot::RockSampleState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RockSampleState>::Chunk_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->states_).
  super__Vector_base<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transition_probabilities_).
  super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->alpha_vectors_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mdp_policy_).
  super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = this;
  std::ifstream::ifstream(&fin,(map->_M_dataplus)._M_p,_S_in);
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  piVar1 = std::operator>>((istream *)&fin,(string *)&tmp);
  piVar1 = std::operator>>(piVar1,(string *)&tmp);
  piVar2 = &local_288->size_;
  piVar1 = (istream *)std::istream::operator>>(piVar1,piVar2);
  std::istream::operator>>(piVar1,piVar2);
  local_268 = &local_288->grid_;
  xsize = *piVar2;
  iVar6 = xsize;
  while (this_00 = local_268, 0 < iVar6) {
    iVar6 = iVar6 + -1;
    for (iVar4 = 0; iVar4 < xsize; iVar4 = iVar4 + 1) {
      std::operator>>((istream *)&fin,&tok);
      if (tok == '-') {
        despot::Coord::Coord((Coord *)&local_278,iVar4,iVar6);
        std::vector<despot::Coord,_std::allocator<despot::Coord>_>::emplace_back<despot::Coord>
                  (local_280,(Coord *)&local_278);
      }
      else if (tok == 'R') {
        despot::Coord::Coord((Coord *)&local_278,iVar4,iVar6);
        *(ulong *)local_260 = CONCAT44(uStack_274,local_278);
      }
      xsize = *piVar2;
    }
  }
  local_288->num_rocks_ =
       (int)((ulong)((long)(local_288->rock_pos_).
                           super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(local_288->rock_pos_).
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  Grid<int>::Resize(local_268,xsize,xsize);
  local_278 = -1;
  Grid<int>::SetAllValues(this_00,&local_278);
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < local_288->num_rocks_; lVar5 = lVar5 + 1) {
    piVar2 = Grid<int>::operator()
                       (this_00,(local_280->
                                super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar3);
    *piVar2 = (int)lVar5;
    lVar3 = lVar3 + 8;
  }
  InitStates(local_288);
  std::__cxx11::string::~string((string *)&tmp);
  std::ifstream::~ifstream(&fin);
  return;
}

Assistant:

BaseRockSample::BaseRockSample(string map) {
	ifstream fin(map.c_str(), ifstream::in);
	string tmp;
	fin >> tmp >> tmp >> size_ >> size_;

	char tok;
	for (int r = size_ - 1; r >= 0; r--) {
		for (int c = 0; c < size_; c++) {
			fin >> tok;
			if (tok == 'R')
				start_pos_ = Coord(c, r);
			else if (tok == '-') {
				rock_pos_.push_back(Coord(c, r));
			}
		}
	}
	num_rocks_ = rock_pos_.size();

	grid_.Resize(size_, size_);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rock_pos_[i]) = i;
	}

	InitStates();

	/*
	 clock_t start = clock();
	 cerr << "Initializing transitions" << endl;
	 InitializeTransitions();
	 cerr << "Done " << (double (clock() - start) / CLOCKS_PER_SEC) << endl;
	 ComputeOptimalPolicyUsingVI();
	 */
}